

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_generator_serialize(secp256k1_context *ctx,uchar *output,secp256k1_generator *gen)

{
  int iVar1;
  secp256k1_fe r;
  secp256k1_ge ge;
  secp256k1_fe local_a0;
  secp256k1_fe local_78;
  secp256k1_fe local_50;
  undefined4 local_28;
  
  secp256k1_fe_set_b32(&local_78,gen->data);
  secp256k1_fe_set_b32(&local_50,gen->data + 0x20);
  local_28 = 0;
  iVar1 = secp256k1_fe_sqrt(&local_a0,&local_50);
  *output = (byte)iVar1 ^ 0xb;
  secp256k1_fe_normalize_var(&local_78);
  secp256k1_fe_get_b32(output + 1,&local_78);
  return 1;
}

Assistant:

int secp256k1_generator_serialize(const secp256k1_context* ctx, unsigned char *output, const secp256k1_generator* gen) {
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(gen != NULL);

    secp256k1_generator_load(&ge, gen);

    output[0] = 11 ^ secp256k1_fe_is_quad_var(&ge.y);
    secp256k1_fe_normalize_var(&ge.x);
    secp256k1_fe_get_b32(&output[1], &ge.x);
    return 1;
}